

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameParseCleanup(Parse *pParse)

{
  sqlite3 *db_00;
  Index *p;
  Index *pIdx;
  sqlite3 *db;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (pParse->pVdbe != (Vdbe *)0x0) {
    sqlite3VdbeFinalize(pParse->pVdbe);
  }
  sqlite3DeleteTable(db_00,pParse->pNewTable);
  while (p = pParse->pNewIndex, p != (Index *)0x0) {
    pParse->pNewIndex = p->pNext;
    sqlite3FreeIndex(db_00,p);
  }
  sqlite3DeleteTrigger(db_00,pParse->pNewTrigger);
  sqlite3DbFree(db_00,pParse->zErrMsg);
  renameTokenFree(db_00,pParse->pRename);
  sqlite3ParserReset(pParse);
  return;
}

Assistant:

static void renameParseCleanup(Parse *pParse){
  sqlite3 *db = pParse->db;
  Index *pIdx;
  if( pParse->pVdbe ){
    sqlite3VdbeFinalize(pParse->pVdbe);
  }
  sqlite3DeleteTable(db, pParse->pNewTable);
  while( (pIdx = pParse->pNewIndex)!=0 ){
    pParse->pNewIndex = pIdx->pNext;
    sqlite3FreeIndex(db, pIdx);
  }
  sqlite3DeleteTrigger(db, pParse->pNewTrigger);
  sqlite3DbFree(db, pParse->zErrMsg);
  renameTokenFree(db, pParse->pRename);
  sqlite3ParserReset(pParse);
}